

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.h
# Opt level: O1

float __thiscall
nv::FloatImage::applyKernel(FloatImage *this,Kernel2 *k,int x,int y,uint c,WrapMode wm)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint e;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  float fVar18;
  
  uVar3 = k->m_windowSize;
  if ((ulong)uVar3 != 0) {
    uVar1 = this->m_width;
    uVar2 = this->m_height;
    iVar12 = 1 - (uVar3 >> 1);
    iVar7 = y + iVar12;
    uVar5 = uVar2 - 1;
    uVar6 = uVar1 - 1;
    fVar18 = 0.0;
    uVar9 = 0;
    do {
      uVar13 = iVar7 + uVar9;
      uVar11 = 0;
      if (0 < (int)uVar13) {
        uVar11 = uVar13;
      }
      if ((int)uVar5 < (int)uVar11) {
        uVar11 = uVar5;
      }
      uVar15 = uVar13;
      if (uVar2 == 1) {
        uVar15 = 0;
      }
      uVar4 = -uVar15;
      if (0 < (int)uVar15) {
        uVar4 = uVar15;
      }
      uVar10 = 0;
      do {
        uVar15 = iVar12 + x + (int)uVar10;
        uVar17 = (uint)uVar1;
        if (wm == WrapMode_Repeat) {
          if ((int)uVar13 < 0) {
            uVar14 = (int)(iVar7 + 1 + uVar9) % (int)(uint)uVar2 + uVar5;
          }
          else {
            uVar14 = uVar13 % (uint)uVar2;
          }
          if ((int)uVar15 < 0) {
            uVar15 = (int)(uVar15 + 1) % (int)uVar17 + uVar6;
          }
          else {
            uVar15 = uVar15 % uVar17;
          }
          iVar16 = uVar14 * uVar1 + uVar15;
        }
        else if (wm == WrapMode_Clamp) {
          if ((int)uVar15 < 1) {
            uVar15 = 0;
          }
          if ((int)uVar6 < (int)uVar15) {
            uVar15 = uVar6;
          }
          iVar16 = uVar15 + uVar11 * uVar1;
        }
        else {
          if (uVar1 == 1) {
            uVar15 = 0;
          }
          uVar14 = -uVar15;
          if (0 < (int)uVar15) {
            uVar14 = uVar15;
          }
          while (uVar15 = uVar4, uVar1 <= uVar14) {
            uVar15 = ((uint)uVar1 * 2 + -2) - uVar14;
            uVar14 = -uVar15;
            if (0 < (int)uVar15) {
              uVar14 = uVar15;
            }
          }
          while (uVar2 <= uVar15) {
            uVar8 = ((uint)uVar2 * 2 + -2) - uVar15;
            uVar15 = -uVar8;
            if (0 < (int)uVar8) {
              uVar15 = uVar8;
            }
          }
          iVar16 = uVar15 * uVar17 + uVar14;
        }
        fVar18 = fVar18 + k->m_data[uVar9 * uVar3 + (int)uVar10] *
                          this->m_mem[(ulong)(c * uVar1 * (uint)uVar2) + (long)iVar16];
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar3);
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar3);
    return fVar18;
  }
  return 0.0;
}

Assistant:

uint windowSize() const {
			return m_windowSize;
		}